

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void sort_data_update_support(stagewise_poly *poly)

{
  undefined8 uVar1;
  uint64_t uVar2;
  bool bVar3;
  ulong uVar4;
  stagewise_poly *poly_00;
  stagewise_poly *psVar5;
  parameters *ppVar6;
  stagewise_poly *poly_01;
  stagewise_poly *psVar7;
  weight *pwVar8;
  sort_data *in_RDI;
  float fVar9;
  double dVar10;
  float fVar11;
  uint64_t pos;
  float weightsal;
  uint64_t wid;
  uint64_t i;
  sort_data *heap_end;
  size_t num_new_features;
  uint64_t pop_ft_offset;
  undefined4 in_stack_ffffffffffffff78;
  weight in_stack_ffffffffffffff7c;
  stagewise_poly *in_stack_ffffffffffffff80;
  sort_data *in_stack_ffffffffffffff88;
  parameters *this;
  undefined4 in_stack_ffffffffffffffa0;
  float fVar12;
  sort_data *__first;
  float local_44;
  ulong local_40;
  parameters *local_28;
  float *local_20;
  
  uVar1 = *(undefined8 *)(*(long *)(in_RDI + 0x694) + 0x6820);
  *(undefined8 *)(in_RDI + 0x688) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0x694) + 0x6820) = 0;
  local_44 = (float)in_RDI[3].wid;
  fVar11 = (float)(long)*(ulong *)(in_RDI + 4);
  fVar12 = (float)*(ulong *)(in_RDI + 4);
  __first = in_RDI;
  dVar10 = std::pow((double)(ulong)(uint)(local_44 / fVar12),(double)(ulong)(uint)in_RDI->wid);
  uVar4 = (ulong)SUB84(dVar10,0);
  poly_00 = (stagewise_poly *)(uVar4 | (long)(SUB84(dVar10,0) - 9.223372e+18) & (long)uVar4 >> 0x3f)
  ;
  psVar5 = (stagewise_poly *)vw::length(*(vw **)in_RDI);
  if (psVar5 < poly_00) {
    poly_00 = (stagewise_poly *)vw::length(*(vw **)in_RDI);
  }
  psVar5 = poly_00;
  sort_data_ensure_sz(poly_00,(size_t)in_stack_ffffffffffffff88);
  local_20 = (float *)in_RDI[1].wid;
  std::make_heap<sort_data*,int(*)(sort_data&,sort_data&)>
            ((sort_data *)psVar5,in_stack_ffffffffffffff88,
             (_func_int_sort_data_ptr_sort_data_ptr *)in_stack_ffffffffffffff80);
  local_28 = (parameters *)0x0;
  while (this = local_28, ppVar6 = (parameters *)vw::length(*(vw **)in_RDI), this != ppVar6) {
    poly_01 = (stagewise_poly *)
              stride_shift(in_stack_ffffffffffffff80,
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    bVar3 = parent_get(psVar5,(uint64_t)this);
    if ((!bVar3) &&
       (in_stack_ffffffffffffff80 = poly_01,
       psVar7 = (stagewise_poly *)constant_feat_masked(poly_01), in_stack_ffffffffffffff80 != psVar7
       )) {
      pwVar8 = parameters::operator[](this,(size_t)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff7c = ABS(*pwVar8);
      pwVar8 = parameters::operator[](this,(size_t)in_stack_ffffffffffffff80);
      fVar9 = in_stack_ffffffffffffff7c * *pwVar8;
      if (1e-09 < fVar9) {
        if (((long)((long)local_20 - in_RDI[1].wid) >> 4 == (long)(int)poly_00) &&
           (*(float *)in_RDI[1].wid < fVar9)) {
          std::pop_heap<sort_data*,int(*)(sort_data&,sort_data&)>
                    ((sort_data *)psVar5,(sort_data *)this,
                     (_func_int_sort_data_ptr_sort_data_ptr *)in_stack_ffffffffffffff80);
          local_20 = local_20 + -4;
        }
        if ((long)((long)local_20 - in_RDI[1].wid) >> 4 < (long)(int)poly_00) {
          *local_20 = fVar9;
          *(stagewise_poly **)(local_20 + 2) = poly_01;
          local_20 = local_20 + 4;
          std::push_heap<sort_data*,int(*)(sort_data&,sort_data&)>
                    (__first,(sort_data *)CONCAT44(fVar12,fVar11),
                     (_func_int_sort_data_ptr_sort_data_ptr *)
                     CONCAT44(local_44,in_stack_ffffffffffffffa0));
        }
      }
    }
    local_28 = (parameters *)&local_28->field_0x1;
  }
  uVar2 = in_RDI[1].wid;
  local_40 = 0;
  while( true ) {
    bVar3 = false;
    if (local_40 < (ulong)((long)((long)local_20 - uVar2) >> 4)) {
      bVar3 = local_40 < *(ulong *)(in_RDI + 2);
    }
    if (!bVar3) break;
    parent_toggle(psVar5,(uint64_t)this);
    local_40 = local_40 + 1;
  }
  *(undefined8 *)(*(long *)(in_RDI + 0x694) + 0x6820) = uVar1;
  *(undefined8 *)(in_RDI + 0x688) = uVar1;
  return;
}

Assistant:

void sort_data_update_support(stagewise_poly &poly)
{
  assert(poly.num_examples);

  // ft_offset affects parent_set / parent_get.  This state must be reset at end.
  uint64_t pop_ft_offset = poly.original_ec->ft_offset;
  poly.synth_ec.ft_offset = 0;
  assert(poly.original_ec);
  poly.original_ec->ft_offset = 0;

  size_t num_new_features = (size_t)pow(poly.sum_input_sparsity * 1.0f / poly.num_examples, poly.sched_exponent);
  num_new_features = (num_new_features > poly.all->length()) ? (uint64_t)poly.all->length() : num_new_features;
  sort_data_ensure_sz(poly, num_new_features);

  sort_data *heap_end = poly.sd;
  make_heap(poly.sd, heap_end, sort_data_compar_heap);  // redundant
  for (uint64_t i = 0; i != poly.all->length(); ++i)
  {
    uint64_t wid = stride_shift(poly, i);
    if (!parent_get(poly, wid) && wid != constant_feat_masked(poly))
    {
      float weightsal = (fabsf(poly.all->weights[wid]) * poly.all->weights[poly.all->normalized_idx + (wid)]);
      /*
       * here's some depth penalization code.  It was found to not improve
       * statistical performance, and meanwhile it is verified as giving
       * a nontrivial computational hit, thus commented out.
       *
       * - poly.magic_argument
       * sqrtf(min_depths_get(poly, stride_shift(poly, i)) * 1.0 / poly.num_examples)
       */
      ;
      if (weightsal > tolerance)
      {
        assert(heap_end >= poly.sd);
        assert(heap_end <= poly.sd + num_new_features);

        if (heap_end - poly.sd == (int)num_new_features && poly.sd->weightsal < weightsal)
        {
          pop_heap(poly.sd, heap_end, sort_data_compar_heap);
          --heap_end;
        }

        assert(heap_end >= poly.sd);
        assert(heap_end < poly.sd + poly.sd_len);

        if (heap_end - poly.sd < (int)num_new_features)
        {
          heap_end->weightsal = weightsal;
          heap_end->wid = wid;
          ++heap_end;
          push_heap(poly.sd, heap_end, sort_data_compar_heap);
        }
      }
    }
  }
  num_new_features = (uint64_t)(heap_end - poly.sd);

#ifdef DEBUG
  // eyeballing weights a pain if unsorted.
  qsort(poly.sd, num_new_features, sizeof(sort_data), sort_data_compar);
#endif  // DEBUG

  for (uint64_t pos = 0; pos < num_new_features && pos < poly.sd_len; ++pos)
  {
    assert(!parent_get(poly, poly.sd[pos].wid) && poly.sd[pos].weightsal > tolerance &&
        poly.sd[pos].wid != constant_feat_masked(poly));
    parent_toggle(poly, poly.sd[pos].wid);
#ifdef DEBUG
    cout << "Adding feature " << pos << "/" << num_new_features << " || wid " << poly.sd[pos].wid << " || sort value "
         << poly.sd[pos].weightsal << endl;
#endif  // DEBUG
  }

#ifdef DEBUG
  cout << "depths:";
  for (uint64_t depth = 0; depth <= poly.max_depth && depth < sizeof(poly.depths) / sizeof(*poly.depths); ++depth)
    cout << "  [" << depth << "] = " << poly.depths[depth];
  cout << endl;

  cout << "Sanity check after sort... " << flush;
  sanity_check_state(poly);
  cout << "done" << endl;
#endif  // DEBUG

  // it's okay that these may have been initially unequal; synth_ec value irrelevant so far.
  poly.original_ec->ft_offset = pop_ft_offset;
  poly.synth_ec.ft_offset = pop_ft_offset;
}